

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
diff_match_patch_test::diff_rebuildtexts_abi_cxx11_
          (deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,diff_match_patch_test *this,
          deque<Diff,_std::allocator<Diff>_> *diffs)

{
  iterator *this_00;
  _Elt_pointer pDVar1;
  reference pbVar2;
  _Elt_pointer pDVar3;
  Diff *myDiff;
  _Elt_pointer pDVar4;
  _Map_pointer local_38;
  
  std::
  _Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::_Deque_base(&__return_storage_ptr__->
                 super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               );
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  pDVar4 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  pDVar3 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  local_38 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  pDVar1 = (diffs->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  this_00 = &(__return_storage_ptr__->
             super__Deque_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start;
  do {
    if (pDVar4 == pDVar1) {
      return __return_storage_ptr__;
    }
    if (pDVar4->operation == Insert) {
LAB_001365df:
      pbVar2 = std::
               _Deque_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*>
               ::operator[](this_00,1);
      std::__cxx11::wstring::append((wstring *)pbVar2);
    }
    else {
      pbVar2 = std::
               _Deque_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*>
               ::operator[](this_00,0);
      std::__cxx11::wstring::append((wstring *)pbVar2);
      if (pDVar4->operation != Delete) goto LAB_001365df;
    }
    pDVar4 = pDVar4 + 1;
    if (pDVar4 == pDVar3) {
      pDVar4 = local_38[1];
      local_38 = local_38 + 1;
      pDVar3 = pDVar4 + 0xc;
    }
  } while( true );
}

Assistant:

std::deque<std::wstring> diff_match_patch_test::diff_rebuildtexts(std::deque<Diff> diffs) {
  std::deque<std::wstring> text;
  text.emplace_back();
  text.emplace_back();
  for (const Diff& myDiff : diffs) {
    if (myDiff.operation != Diff::Operation::Insert) {
      text[0] += myDiff.text;
    }
    if (myDiff.operation != Diff::Operation::Delete) {
      text[1] += myDiff.text;
    }
  }
  return text;
}